

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O1

void __thiscall ASTree::expandDot(ASTree *this,Graph *graph)

{
  pointer ppAVar1;
  ASTree *ast;
  pointer ppAVar2;
  string nameSub;
  string name;
  string local_178;
  string local_158;
  ASTree *local_138;
  string local_130;
  Connection local_110;
  Node local_b0;
  
  dotName_abi_cxx11_(&local_130,this,this);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"circle","");
  Node::Node(&local_b0,&local_130,&this->root,&local_178);
  Graph::addNode(graph,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.extra._M_dataplus._M_p != &local_b0.extra.field_2) {
    operator_delete(local_b0.extra._M_dataplus._M_p,local_b0.extra.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.shape._M_dataplus._M_p != &local_b0.shape.field_2) {
    operator_delete(local_b0.shape._M_dataplus._M_p,local_b0.shape.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.label._M_dataplus._M_p != &local_b0.label.field_2) {
    operator_delete(local_b0.label._M_dataplus._M_p,local_b0.label.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
    operator_delete(local_b0.name._M_dataplus._M_p,local_b0.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  ppAVar2 = (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppAVar1 = (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_138 = this;
  if (ppAVar2 != ppAVar1) {
    do {
      ast = *ppAVar2;
      dotName_abi_cxx11_(&local_178,local_138,ast);
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      Connection::Connection(&local_110,&local_130,&local_178,&local_158);
      Graph::addConnection(graph,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.label._M_dataplus._M_p != &local_110.label.field_2) {
        operator_delete(local_110.label._M_dataplus._M_p,
                        local_110.label.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.name_to._M_dataplus._M_p != &local_110.name_to.field_2) {
        operator_delete(local_110.name_to._M_dataplus._M_p,
                        local_110.name_to.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.name_from._M_dataplus._M_p != &local_110.name_from.field_2) {
        operator_delete(local_110.name_from._M_dataplus._M_p,
                        local_110.name_from.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      expandDot(ast,graph);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      ppAVar2 = ppAVar2 + 1;
    } while (ppAVar2 != ppAVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ASTree::expandDot(Graph &graph) {


    std::string name = dotName(this);

    graph.addNode(Node(name, root, "circle"));

    for (auto subtree: subtrees) {

        std::string nameSub = dotName(subtree);

        graph.addConnection(Connection(name, nameSub, ""));

        subtree->expandDot(graph);
    }
}